

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::SetCurrentLinkType(cmComputeLinkInformation *this,LinkType lt)

{
  pointer pcVar1;
  Item local_48;
  
  if ((this->CurrentLinkType != lt) && (this->CurrentLinkType = lt, this->LinkTypeEnabled == true))
  {
    if (lt == LinkShared) {
      local_48.Value._M_dataplus._M_p = (pointer)&local_48.Value.field_2;
      pcVar1 = (this->SharedLinkTypeFlag)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + (this->SharedLinkTypeFlag)._M_string_length);
      local_48.IsPath = false;
      local_48.Target = (cmGeneratorTarget *)0x0;
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_48);
    }
    else {
      if (lt != LinkStatic) {
        return;
      }
      local_48.Value._M_dataplus._M_p = (pointer)&local_48.Value.field_2;
      pcVar1 = (this->StaticLinkTypeFlag)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + (this->StaticLinkTypeFlag)._M_string_length);
      local_48.IsPath = false;
      local_48.Target = (cmGeneratorTarget *)0x0;
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.Value._M_dataplus._M_p != &local_48.Value.field_2) {
      operator_delete(local_48.Value._M_dataplus._M_p,
                      local_48.Value.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::SetCurrentLinkType(LinkType lt)
{
  // If we are changing the current link type add the flag to tell the
  // linker about it.
  if (this->CurrentLinkType != lt) {
    this->CurrentLinkType = lt;

    if (this->LinkTypeEnabled) {
      switch (this->CurrentLinkType) {
        case LinkStatic:
          this->Items.push_back(Item(this->StaticLinkTypeFlag, false));
          break;
        case LinkShared:
          this->Items.push_back(Item(this->SharedLinkTypeFlag, false));
          break;
        default:
          break;
      }
    }
  }
}